

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::tighten(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  type_conflict5 tVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  ulong uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  double local_140;
  undefined1 local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  uint local_128 [23];
  undefined3 uStack_cb;
  undefined5 uStack_c8;
  undefined8 local_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  psVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_138,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar4 = -(ulong)(*(Real *)((long)local_138 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_b0,
             (double)(~uVar4 & (ulong)(*(Real *)((long)local_138 + 0x40) * 1e-05) |
                     uVar4 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
  pnVar3 = &this->fastDelta;
  local_c0._0_4_ = cpp_dec_float_finite;
  local_c0._4_4_ = 0x1c;
  local_138 = (undefined1  [8])0x0;
  _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128[0] = 0;
  local_128[1] = 0;
  local_128[2] = 0;
  local_128[3] = 0;
  local_128[4] = 0;
  local_128[5] = 0;
  local_128[6] = 0;
  local_128[7] = 0;
  local_128[8] = 0;
  local_128[9] = 0;
  local_128[10] = 0;
  local_128[0xb] = 0;
  local_128[0xc] = 0;
  local_128[0xd] = 0;
  local_128[0xe] = 0;
  local_128[0xf] = 0;
  local_128[0x10] = 0;
  local_128[0x11] = 0;
  local_128[0x12] = 0;
  local_128[0x13] = 0;
  local_128[0x14] = 0;
  local_128[0x15] = 0;
  stack0xffffffffffffff30 = 0;
  uStack_cb = 0;
  uStack_c8._0_4_ = 0;
  uStack_c8._4_1_ = false;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_138,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta.m_backend,&local_b0);
  tVar2 = boost::multiprecision::operator>=
                    (pnVar3,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_138);
  if (tVar2) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&pnVar3->m_backend,&local_b0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_138,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    uVar4 = -(ulong)(*(Real *)((long)local_138 + 0x40) == 1.0);
    local_140 = (double)(~uVar4 & (ulong)(*(Real *)((long)local_138 + 0x40) * 0.0001) |
                        uVar4 & 0x3f1a36e2eb1c432d);
    tVar2 = boost::multiprecision::operator>(pnVar3,&local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
    if (tVar2) {
      local_c0._0_4_ = cpp_dec_float_finite;
      local_c0._4_4_ = 0x1c;
      local_138 = (undefined1  [8])0x0;
      _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128[0] = 0;
      local_128[1] = 0;
      local_128[2] = 0;
      local_128[3] = 0;
      local_128[4] = 0;
      local_128[5] = 0;
      local_128[6] = 0;
      local_128[7] = 0;
      local_128[8] = 0;
      local_128[9] = 0;
      local_128[10] = 0;
      local_128[0xb] = 0;
      local_128[0x14] = 0;
      local_128[0x15] = 0;
      stack0xffffffffffffff30 = 0;
      uStack_cb = 0;
      uStack_c8._0_4_ = 0;
      uStack_c8._4_1_ = false;
      local_128[0xc] = 0;
      local_128[0xd] = 0;
      local_128[0xe] = 0;
      local_128[0xf] = 0;
      local_128[0x10] = 0;
      local_128[0x11] = 0;
      local_128[0x12] = 0;
      local_128[0x13] = 0;
      local_140 = 9.88131291682493e-324;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_138,&local_b0,(longlong *)&local_140);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&pnVar3->m_backend,(cpp_dec_float<200U,_int,_void> *)local_138);
    }
  }
  pnVar3 = &this->minStab;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_138,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar4 = -(ulong)(*(Real *)((long)local_138 + 0x40) == 1.0);
  local_140 = (double)(~uVar4 & (ulong)(*(Real *)((long)local_138 + 0x40) * 1e-05) |
                      uVar4 & 0x3ee4f8b588e368f1);
  tVar2 = boost::multiprecision::operator<(pnVar3,&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
  if (tVar2) {
    local_138 = (undefined1  [8])0x3feccccccccccccd;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&pnVar3->m_backend,(double *)local_138);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_138,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    local_140 = Tolerances::floatingPointFeastol((Tolerances *)local_138);
    tVar2 = boost::multiprecision::operator<(pnVar3,&local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
    if (tVar2) {
      local_138 = (undefined1  [8])0x3feccccccccccccd;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&pnVar3->m_backend,(double *)local_138);
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}